

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

void __thiscall
CLI::IsMember::
IsMember<std::vector<char_const*,std::allocator<char_const*>>,std::__cxx11::string(*)(std::__cxx11::string)>
          (IsMember *this,vector<const_char_*,_std::allocator<const_char_*>_> *set,
          _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *filter_function)

{
  anon_class_56_2_19789555 local_a0;
  anon_class_24_1_ba1d77c2 local_58;
  undefined1 local_40 [8];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  filter_fn;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
  *filter_function_local;
  vector<const_char_*,_std::allocator<const_char_*>_> *set_local;
  IsMember *this_local;
  
  filter_fn._M_invoker = (_Invoker_type)filter_function;
  Validator::Validator(&this->super_Validator);
  std::function<std::__cxx11::string(std::__cxx11::string)>::
  function<std::__cxx11::string(*&)(std::__cxx11::string),void>
            ((function<std::__cxx11::string(std::__cxx11::string)> *)local_40,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              **)&filter_fn._M_invoker);
  _GLOBAL__N_1::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_58.set,set);
  std::function<std::__cxx11::string()>::operator=
            ((function<std::__cxx11::string()> *)this,&local_58);
  IsMember<std::vector<char_const*,std::allocator<char_const*>>,std::__cxx11::string(*)(std::__cxx11::string)>(std::vector<char_const*,std::allocator<char_const*>>,std::__cxx11::string(*)(std::__cxx11::string))
  ::{lambda()#1}::~IsMember((_lambda___1_ *)&local_58);
  _GLOBAL__N_1::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_a0.set,set);
  _GLOBAL__N_1::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::function(&local_a0.filter_fn,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
              *)local_40);
  std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,&local_a0);
  IsMember<std::vector<char_const*,std::allocator<char_const*>>,std::__cxx11::string(*)(std::__cxx11::string)>(std::vector<char_const*,std::allocator<char_const*>>,std::__cxx11::string(*)(std::__cxx11::string))
  ::{lambda(std::__cxx11::string&)#1}::~IsMember((_lambda_std____cxx11__string___1_ *)&local_a0);
  _GLOBAL__N_1::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
               *)local_40);
  return;
}

Assistant:

explicit IsMember(T set, F filter_function) {

        // Get the type of the contained item - requires a container have ::value_type
        // if the type does not have first_type and second_type, these are both value_type
        using element_t = typename detail::element_type<T>::type;             // Removes (smart) pointers if needed
        using item_t = typename detail::pair_adaptor<element_t>::first_type;  // Is value_type if not a map

        using local_item_t = typename IsMemberType<item_t>::type;  // This will convert bad types to good ones
                                                                   // (const char * to std::string)

        // Make a local copy of the filter function, using a std::function if not one already
        std::function<local_item_t(local_item_t)> filter_fn = filter_function;

        // This is the type name for help, it will take the current version of the set contents
        desc_function_ = [set]() { return detail::generate_set(detail::smart_deref(set)); };

        // This is the function that validates
        // It stores a copy of the set pointer-like, so shared_ptr will stay alive
        func_ = [set, filter_fn](std::string &input) {
            using CLI::detail::lexical_cast;
            local_item_t b;
            if(!lexical_cast(input, b)) {
                throw ValidationError(input);  // name is added later
            }
            if(filter_fn) {
                b = filter_fn(b);
            }
            auto res = detail::search(set, b, filter_fn);
            if(res.first) {
                // Make sure the version in the input string is identical to the one in the set
                if(filter_fn) {
                    input = detail::value_string(detail::pair_adaptor<element_t>::first(*(res.second)));
                }

                // Return empty error string (success)
                return std::string{};
            }

            // If you reach this point, the result was not found
            return input + " not in " + detail::generate_set(detail::smart_deref(set));
        };
    }